

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O0

int Rml::Math::Log2(int value)

{
  undefined4 local_10;
  undefined4 local_c;
  int result;
  int value_local;
  
  local_10 = 0;
  for (local_c = value; 1 < local_c; local_c = local_c >> 1) {
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

RMLUICORE_API int Log2(int value)
	{
		int result = 0;
		while (value > 1)
		{
			value >>= 1;
			result++;
		}
		return result;
	}